

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_op.hpp
# Opt level: O0

void __thiscall
asio::detail::reactor_op::reactor_op
          (reactor_op *this,perform_func_type perform_func,func_type complete_func)

{
  func_type in_RDX;
  scheduler_operation *in_RSI;
  scheduler_operation *in_RDI;
  
  scheduler_operation::scheduler_operation(in_RDI,in_RDX);
  std::error_code::error_code((error_code *)in_RDI);
  *(undefined8 *)&in_RDI[1].task_result_ = 0;
  in_RDI[2].next_ = in_RSI;
  return;
}

Assistant:

reactor_op(perform_func_type perform_func, func_type complete_func)
    : operation(complete_func),
      bytes_transferred_(0),
      perform_func_(perform_func)
  {
  }